

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_test.cpp
# Opt level: O1

int findParam(string *param,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  allocator<char> local_51;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if (0 < argc) {
    iVar2 = -1;
    uVar3 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,argv[uVar3 - 1],&local_51);
      if (local_48 == param->_M_string_length) {
        if (local_48 == 0) {
          bVar5 = true;
        }
        else {
          iVar1 = bcmp(local_50,(param->_M_dataplus)._M_p,local_48);
          bVar5 = iVar1 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      bVar4 = uVar3 < (uint)argc;
      iVar2 = iVar2 + 1;
      uVar3 = uVar3 + 1;
    } while (bVar4 && !bVar5);
    iVar1 = -1;
    if (bVar5) {
      iVar1 = iVar2;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

int findParam ( string param,int argc,char **argv ) {
    int idx=-1;
    for ( int i=0; i<argc && idx==-1; i++ )
        if ( string ( argv[i] ) ==param ) idx=i;
    return idx;

}